

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_hint_table_record(PSH_Hint_Table table,FT_UInt idx)

{
  uint uVar1;
  PSH_Hint_conflict hint2_00;
  FT_Int FVar2;
  PSH_Hint_conflict hint1;
  PSH_Hint_conflict hint2;
  PSH_Hint_conflict *ppPStack_28;
  FT_UInt count;
  PSH_Hint_conflict *sorted;
  PSH_Hint_conflict hint;
  FT_UInt idx_local;
  PSH_Hint_Table table_local;
  
  hint1 = table->hints + idx;
  if ((idx < table->max_hints) && ((hint1->flags & 4) == 0)) {
    hint1->flags = hint1->flags | 4;
    ppPStack_28 = table->sort_global;
    hint2._4_4_ = table->num_hints;
    hint1->parent = (PSH_Hint)0x0;
    for (; hint2._4_4_ != 0; hint2._4_4_ = hint2._4_4_ - 1) {
      hint2_00 = *ppPStack_28;
      FVar2 = psh_hint_overlap(hint1,hint2_00);
      if (FVar2 != 0) {
        hint1->parent = hint2_00;
        break;
      }
      ppPStack_28 = ppPStack_28 + 1;
    }
    if (table->num_hints < table->max_hints) {
      uVar1 = table->num_hints;
      table->num_hints = uVar1 + 1;
      table->sort_global[uVar1] = hint1;
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_record( PSH_Hint_Table  table,
                         FT_UInt         idx )
  {
    PSH_Hint  hint = table->hints + idx;


    if ( idx >= table->max_hints )
    {
      FT_TRACE0(( "psh_hint_table_record: invalid hint index %d\n", idx ));
      return;
    }

    /* ignore active hints */
    if ( psh_hint_is_active( hint ) )
      return;

    psh_hint_activate( hint );

    /* now scan the current active hint set to check */
    /* whether `hint' overlaps with another hint     */
    {
      PSH_Hint*  sorted = table->sort_global;
      FT_UInt    count  = table->num_hints;
      PSH_Hint   hint2;


      hint->parent = NULL;
      for ( ; count > 0; count--, sorted++ )
      {
        hint2 = sorted[0];

        if ( psh_hint_overlap( hint, hint2 ) )
        {
          hint->parent = hint2;
          break;
        }
      }
    }

    if ( table->num_hints < table->max_hints )
      table->sort_global[table->num_hints++] = hint;
    else
      FT_TRACE0(( "psh_hint_table_record: too many sorted hints!  BUG!\n" ));
  }